

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

void mspace_free(mspace msp,void *mem)

{
  long *plVar1;
  size_t __len;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  long lVar13;
  ulong *puVar14;
  ulong *puVar15;
  long lVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong *puVar19;
  
  if (mem == (void *)0x0) {
    return;
  }
  puVar12 = *(ulong **)((long)msp + 0x18);
  puVar15 = (ulong *)((long)mem + -0x10);
  if ((puVar15 < puVar12) || (uVar10 = *(ulong *)((long)mem + -8), ((uint)uVar10 & 3) == 1))
  goto LAB_0012ffa7;
  uVar8 = uVar10 & 0xfffffffffffffff8;
  puVar14 = (ulong *)((long)puVar15 + uVar8);
  if ((uVar10 & 1) == 0) {
    uVar2 = *puVar15;
    if ((uVar10 & 2) == 0) {
      __len = uVar8 + 0x20 + uVar2;
      iVar6 = munmap((void *)((long)puVar15 - uVar2),__len);
      if (iVar6 != 0) {
        return;
      }
      *(long *)((long)msp + 0x358) = *(long *)((long)msp + 0x358) - __len;
      return;
    }
    puVar15 = (ulong *)((long)puVar15 - uVar2);
    if (puVar15 < puVar12) goto LAB_0012ffa7;
    uVar8 = uVar8 + uVar2;
    if (puVar15 == *(ulong **)((long)msp + 0x20)) {
      uVar10 = puVar14[1];
      if ((~(uint)uVar10 & 3) == 0) {
        *(ulong *)((long)msp + 8) = uVar8;
        puVar14[1] = uVar10 & 0xfffffffffffffffe;
        puVar15[1] = uVar8 | 1;
        *puVar14 = uVar8;
        return;
      }
    }
    else if (uVar2 < 0x100) {
      puVar17 = (ulong *)puVar15[2];
      puVar19 = (ulong *)puVar15[3];
      puVar11 = (ulong *)((long)msp + (uVar2 >> 3) * 0x10 + 0x48);
      if ((puVar17 != puVar11) && ((puVar17 < puVar12 || ((ulong *)puVar17[3] != puVar15))))
      goto LAB_0012ffa7;
      if (puVar19 == puVar17) {
        bVar5 = (byte)(uVar2 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
      }
      else {
        if ((puVar19 != puVar11) && ((puVar19 < puVar12 || ((ulong *)puVar19[2] != puVar15))))
        goto LAB_0012ffa7;
        puVar17[3] = (ulong)puVar19;
        puVar19[2] = (ulong)puVar17;
      }
    }
    else {
      puVar11 = (ulong *)puVar15[3];
      uVar10 = puVar15[6];
      if (puVar11 == puVar15) {
        if ((ulong *)puVar15[5] == (ulong *)0x0) {
          if ((ulong *)puVar15[4] == (ulong *)0x0) {
            puVar11 = (ulong *)0x0;
            goto LAB_0012fb05;
          }
          puVar17 = (ulong *)puVar15[4];
          puVar19 = puVar15 + 4;
        }
        else {
          puVar17 = (ulong *)puVar15[5];
          puVar19 = puVar15 + 5;
        }
        do {
          do {
            puVar18 = puVar19;
            puVar11 = puVar17;
            puVar17 = (ulong *)puVar11[5];
            puVar19 = puVar11 + 5;
          } while ((ulong *)puVar11[5] != (ulong *)0x0);
          puVar17 = (ulong *)puVar11[4];
          puVar19 = puVar11 + 4;
        } while ((ulong *)puVar11[4] != (ulong *)0x0);
        if (puVar18 < puVar12) goto LAB_0012ffa7;
        *puVar18 = 0;
      }
      else {
        puVar17 = (ulong *)puVar15[2];
        if (((puVar17 < puVar12) || ((ulong *)puVar17[3] != puVar15)) ||
           ((ulong *)puVar11[2] != puVar15)) goto LAB_0012ffa7;
        puVar17[3] = (ulong)puVar11;
        puVar11[2] = (ulong)puVar17;
      }
LAB_0012fb05:
      if (uVar10 != 0) {
        uVar7 = (uint)puVar15[7];
        if (puVar15 == *(ulong **)((long)msp + (ulong)uVar7 * 8 + 600)) {
          *(ulong **)((long)msp + (ulong)uVar7 * 8 + 600) = puVar11;
          if (puVar11 == (ulong *)0x0) {
            bVar5 = (byte)uVar7 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
          }
          else {
LAB_0012fb47:
            puVar12 = *(ulong **)((long)msp + 0x18);
            if (puVar11 < puVar12) goto LAB_0012ffa7;
            puVar11[6] = uVar10;
            puVar17 = (ulong *)puVar15[4];
            if (puVar17 != (ulong *)0x0) {
              if (puVar17 < puVar12) goto LAB_0012ffa7;
              puVar11[4] = (ulong)puVar17;
              puVar17[6] = (ulong)puVar11;
            }
            uVar10 = puVar15[5];
            if (uVar10 != 0) {
              if (uVar10 < *(ulong *)((long)msp + 0x18)) goto LAB_0012ffa7;
              puVar11[5] = uVar10;
              *(ulong **)(uVar10 + 0x30) = puVar11;
            }
          }
        }
        else {
          if (uVar10 < *(ulong *)((long)msp + 0x18)) goto LAB_0012ffa7;
          *(ulong **)(uVar10 + 0x20 + (ulong)(*(ulong **)(uVar10 + 0x20) != puVar15) * 8) = puVar11;
          if (puVar11 != (ulong *)0x0) goto LAB_0012fb47;
        }
      }
    }
  }
  if ((puVar14 <= puVar15) || (uVar10 = puVar14[1], (uVar10 & 1) == 0)) goto LAB_0012ffa7;
  if ((uVar10 & 2) == 0) {
    if (puVar14 == *(ulong **)((long)msp + 0x28)) {
      uVar8 = uVar8 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar8;
      *(ulong **)((long)msp + 0x28) = puVar15;
      puVar15[1] = uVar8 | 1;
      if (puVar15 == *(ulong **)((long)msp + 0x20)) {
        *(undefined8 *)((long)msp + 0x20) = 0;
        *(undefined8 *)((long)msp + 8) = 0;
      }
      if (uVar8 <= *(ulong *)((long)msp + 0x30)) {
        return;
      }
      sys_trim((mstate)msp,0);
      return;
    }
    if (puVar14 == *(ulong **)((long)msp + 0x20)) {
      uVar8 = uVar8 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar8;
      *(ulong **)((long)msp + 0x20) = puVar15;
      puVar15[1] = uVar8 | 1;
      *(ulong *)((long)puVar15 + uVar8) = uVar8;
      return;
    }
    if (uVar10 < 0x100) {
      uVar3 = puVar14[2];
      uVar4 = puVar14[3];
      uVar2 = (long)msp + (uVar10 >> 3) * 0x10 + 0x48;
      if ((uVar3 != uVar2) &&
         ((uVar3 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar3 + 0x18) != puVar14))))
      goto LAB_0012ffa7;
      if (uVar4 == uVar3) {
        bVar5 = (byte)(uVar10 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
      }
      else {
        if ((uVar4 != uVar2) &&
           ((uVar4 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar4 + 0x10) != puVar14))))
        goto LAB_0012ffa7;
        *(ulong *)(uVar3 + 0x18) = uVar4;
        *(ulong *)(uVar4 + 0x10) = uVar3;
      }
    }
    else {
      puVar12 = (ulong *)puVar14[3];
      uVar2 = puVar14[6];
      if (puVar12 == puVar14) {
        if ((ulong *)puVar14[5] == (ulong *)0x0) {
          if ((ulong *)puVar14[4] == (ulong *)0x0) {
            puVar12 = (ulong *)0x0;
            goto LAB_0012fee7;
          }
          puVar11 = (ulong *)puVar14[4];
          puVar17 = puVar14 + 4;
        }
        else {
          puVar11 = (ulong *)puVar14[5];
          puVar17 = puVar14 + 5;
        }
        do {
          do {
            puVar19 = puVar17;
            puVar12 = puVar11;
            puVar11 = (ulong *)puVar12[5];
            puVar17 = puVar12 + 5;
          } while ((ulong *)puVar12[5] != (ulong *)0x0);
          puVar11 = (ulong *)puVar12[4];
          puVar17 = puVar12 + 4;
        } while ((ulong *)puVar12[4] != (ulong *)0x0);
        if (puVar19 < *(ulong **)((long)msp + 0x18)) goto LAB_0012ffa7;
        *puVar19 = 0;
      }
      else {
        uVar3 = puVar14[2];
        if (((uVar3 < *(ulong *)((long)msp + 0x18)) || (*(ulong **)(uVar3 + 0x18) != puVar14)) ||
           ((ulong *)puVar12[2] != puVar14)) goto LAB_0012ffa7;
        *(ulong **)(uVar3 + 0x18) = puVar12;
        puVar12[2] = uVar3;
      }
LAB_0012fee7:
      if (uVar2 != 0) {
        uVar7 = (uint)puVar14[7];
        if (puVar14 == *(ulong **)((long)msp + (ulong)uVar7 * 8 + 600)) {
          *(ulong **)((long)msp + (ulong)uVar7 * 8 + 600) = puVar12;
          if (puVar12 == (ulong *)0x0) {
            bVar5 = (byte)uVar7 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
          }
          else {
LAB_0012ff25:
            puVar11 = *(ulong **)((long)msp + 0x18);
            if (puVar12 < puVar11) goto LAB_0012ffa7;
            puVar12[6] = uVar2;
            puVar17 = (ulong *)puVar14[4];
            if (puVar17 != (ulong *)0x0) {
              if (puVar17 < puVar11) goto LAB_0012ffa7;
              puVar12[4] = (ulong)puVar17;
              puVar17[6] = (ulong)puVar12;
            }
            uVar2 = puVar14[5];
            if (uVar2 != 0) {
              if (uVar2 < *(ulong *)((long)msp + 0x18)) goto LAB_0012ffa7;
              puVar12[5] = uVar2;
              *(ulong **)(uVar2 + 0x30) = puVar12;
            }
          }
        }
        else {
          if (uVar2 < *(ulong *)((long)msp + 0x18)) goto LAB_0012ffa7;
          *(ulong **)(uVar2 + 0x20 + (ulong)(*(ulong **)(uVar2 + 0x20) != puVar14) * 8) = puVar12;
          if (puVar12 != (ulong *)0x0) goto LAB_0012ff25;
        }
      }
    }
    uVar8 = uVar8 + (uVar10 & 0xfffffffffffffff8);
    puVar15[1] = uVar8 | 1;
    *(ulong *)((long)puVar15 + uVar8) = uVar8;
    if (puVar15 == *(ulong **)((long)msp + 0x20)) {
      *(ulong *)((long)msp + 8) = uVar8;
      return;
    }
  }
  else {
    puVar14[1] = uVar10 & 0xfffffffffffffffe;
    puVar15[1] = uVar8 | 1;
    *(ulong *)((long)puVar15 + uVar8) = uVar8;
  }
  if (uVar8 < 0x100) {
    uVar10 = (long)msp + (uVar8 >> 3) * 0x10 + 0x48;
    uVar7 = (uint)(uVar8 >> 3);
    if ((*msp >> (uVar7 & 0x1f) & 1) == 0) {
      *(uint *)msp = *msp | 1 << (uVar7 & 0x1f);
      uVar8 = uVar10;
    }
    else {
      uVar8 = *(ulong *)(uVar10 + 0x10);
      if (*(ulong *)(uVar10 + 0x10) < *(ulong *)((long)msp + 0x18)) {
LAB_0012ffa7:
        abort();
      }
    }
    *(ulong **)(uVar10 + 0x10) = puVar15;
    *(ulong **)(uVar8 + 0x18) = puVar15;
    puVar15[2] = uVar8;
    puVar15[3] = uVar10;
  }
  else {
    uVar7 = (uint)(uVar8 >> 8);
    if (uVar7 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0x1f;
      if (uVar7 < 0x10000) {
        uVar9 = ((uint)(uVar8 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar7)) & 0x3f)) & 1) +
                LZCOUNT(uVar7) * 2 ^ 0x3e;
      }
    }
    *(uint *)(puVar15 + 7) = uVar9;
    puVar12 = (ulong *)((long)msp + (ulong)uVar9 * 8 + 600);
    puVar15[4] = 0;
    puVar15[5] = 0;
    if ((*(uint *)((long)msp + 4) >> (uVar9 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << (uVar9 & 0x1f);
      puVar14 = puVar12;
    }
    else {
      uVar10 = (ulong)(byte)(0x39 - (char)(uVar9 >> 1));
      if (uVar9 == 0x1f) {
        uVar10 = 0;
      }
      lVar13 = uVar8 << (uVar10 & 0x3f);
      puVar12 = (ulong *)*puVar12;
      do {
        puVar11 = puVar12;
        if ((puVar11[1] & 0xfffffffffffffff8) == uVar8) {
          if ((puVar11 < *(ulong **)((long)msp + 0x18)) ||
             (puVar14 = (ulong *)puVar11[2], puVar14 < *(ulong **)((long)msp + 0x18)))
          goto LAB_0012ffa7;
          puVar12 = puVar11 + 2;
          lVar13 = 0x30;
          lVar16 = 0x10;
          puVar17 = (ulong *)0x0;
          puVar14[3] = (ulong)puVar15;
          goto LAB_0012fe27;
        }
        lVar16 = lVar13 >> 0x3f;
        lVar13 = lVar13 * 2;
        puVar12 = (ulong *)puVar11[4 - lVar16];
      } while ((ulong *)puVar11[4 - lVar16] != (ulong *)0x0);
      puVar12 = puVar11 + (4 - lVar16);
      puVar14 = puVar11;
      if (puVar12 < *(ulong **)((long)msp + 0x18)) goto LAB_0012ffa7;
    }
    lVar16 = 0x30;
    lVar13 = 0x10;
    puVar11 = puVar15;
    puVar17 = puVar15;
LAB_0012fe27:
    *puVar12 = (ulong)puVar15;
    *(ulong **)((long)puVar15 + lVar16) = puVar14;
    puVar15[3] = (ulong)puVar11;
    *(ulong **)((long)puVar15 + lVar13) = puVar17;
    plVar1 = (long *)((long)msp + 0x38);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      release_unused_segments((mstate)msp);
      return;
    }
  }
  return;
}

Assistant:

void mspace_free(mspace msp, void* mem) {
  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    (void)msp; /* placate people compiling -Wunused */
#else /* FOOTERS */
    mstate fm = (mstate)msp;
#endif /* FOOTERS */
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
}